

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *p_cp,opj_event_mgr_t *p_manager)

{
  uint uVar1;
  opj_msg_callback p_Var2;
  OPJ_BYTE *p_buffer;
  OPJ_BYTE *l_data_1;
  OPJ_UINT32 l_data_size_1;
  OPJ_UINT32 l_N_ppm_1;
  OPJ_BYTE *l_data;
  uint local_30;
  OPJ_UINT32 l_data_size;
  OPJ_UINT32 l_N_ppm;
  OPJ_UINT32 l_N_ppm_remaining;
  OPJ_UINT32 l_ppm_data_size;
  OPJ_UINT32 i;
  opj_event_mgr_t *p_manager_local;
  opj_cp_t *p_cp_local;
  
  _l_ppm_data_size = p_manager;
  p_manager_local = (opj_event_mgr_t *)p_cp;
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xf10,"OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *, opj_event_mgr_t *)");
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    if (p_cp->ppm_buffer != (OPJ_BYTE *)0x0) {
      __assert_fail("p_cp->ppm_buffer == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0xf12,"OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *, opj_event_mgr_t *)");
    }
    if ((p_cp->field_0x90 & 1) == 0) {
      p_cp_local._4_4_ = 1;
    }
    else {
      l_N_ppm = 0;
      l_data_size = 0;
      for (l_N_ppm_remaining = 0; l_N_ppm_remaining < *(uint *)&p_manager_local->info_handler;
          l_N_ppm_remaining = l_N_ppm_remaining + 1) {
        if (*(long *)((long)p_manager_local[1].m_error_data + (ulong)l_N_ppm_remaining * 0x10) != 0)
        {
          uVar1 = *(uint *)((long)p_manager_local[1].m_error_data +
                           (ulong)l_N_ppm_remaining * 0x10 + 8);
          _l_data_size_1 =
               *(OPJ_BYTE **)
                ((long)p_manager_local[1].m_error_data + (ulong)l_N_ppm_remaining * 0x10);
          if (l_data_size < uVar1) {
            _l_data_size_1 = _l_data_size_1 + l_data_size;
            l_data._4_4_ = uVar1 - l_data_size;
            l_data_size = 0;
          }
          else {
            l_data_size = l_data_size - uVar1;
            l_data._4_4_ = 0;
          }
          while (l_data._4_4_ != 0) {
            if (l_data._4_4_ < 4) {
              opj_event_msg(_l_ppm_data_size,1,"Not enough bytes to read Nppm\n");
              return 0;
            }
            opj_read_bytes_LE(_l_data_size_1,&local_30,4);
            _l_data_size_1 = _l_data_size_1 + 4;
            uVar1 = l_data._4_4_ - 4;
            l_N_ppm = local_30 + l_N_ppm;
            if (uVar1 < local_30) {
              l_data_size = local_30 - uVar1;
              l_data._4_4_ = 0;
            }
            else {
              l_data._4_4_ = uVar1 - local_30;
              _l_data_size_1 = _l_data_size_1 + local_30;
            }
          }
        }
      }
      if (l_data_size == 0) {
        p_Var2 = (opj_msg_callback)opj_malloc((ulong)l_N_ppm);
        p_manager_local[1].warning_handler = p_Var2;
        if (p_manager_local[1].warning_handler == (opj_msg_callback)0x0) {
          opj_event_msg(_l_ppm_data_size,1,"Not enough memory to read PPM marker\n");
          p_cp_local._4_4_ = 0;
        }
        else {
          *(OPJ_UINT32 *)&p_manager_local[1].m_info_data = l_N_ppm;
          l_N_ppm = 0;
          l_data_size = 0;
          for (l_N_ppm_remaining = 0; l_N_ppm_remaining < *(uint *)&p_manager_local->info_handler;
              l_N_ppm_remaining = l_N_ppm_remaining + 1) {
            if (*(long *)((long)p_manager_local[1].m_error_data + (ulong)l_N_ppm_remaining * 0x10)
                != 0) {
              l_data_1._0_4_ =
                   *(uint *)((long)p_manager_local[1].m_error_data +
                            (ulong)l_N_ppm_remaining * 0x10 + 8);
              p_buffer = *(OPJ_BYTE **)
                          ((long)p_manager_local[1].m_error_data + (ulong)l_N_ppm_remaining * 0x10);
              if (l_data_size < (uint)l_data_1) {
                memcpy(p_manager_local[1].warning_handler + l_N_ppm,p_buffer,(ulong)l_data_size);
                l_N_ppm = l_data_size + l_N_ppm;
                p_buffer = p_buffer + l_data_size;
                l_data_1._0_4_ = (uint)l_data_1 - l_data_size;
                l_data_size = 0;
              }
              else {
                memcpy(p_manager_local[1].warning_handler + l_N_ppm,p_buffer,(ulong)(uint)l_data_1);
                l_N_ppm = (uint)l_data_1 + l_N_ppm;
                l_data_size = l_data_size - (uint)l_data_1;
                l_data_1._0_4_ = 0;
              }
              while ((uint)l_data_1 != 0) {
                if ((uint)l_data_1 < 4) {
                  opj_event_msg(_l_ppm_data_size,1,"Not enough bytes to read Nppm\n");
                  return 0;
                }
                opj_read_bytes_LE(p_buffer,(OPJ_UINT32 *)((long)&l_data_1 + 4),4);
                p_buffer = p_buffer + 4;
                l_data_1._0_4_ = (uint)l_data_1 - 4;
                if ((uint)l_data_1 < l_data_1._4_4_) {
                  memcpy(p_manager_local[1].warning_handler + l_N_ppm,p_buffer,(ulong)(uint)l_data_1
                        );
                  l_N_ppm = (uint)l_data_1 + l_N_ppm;
                  l_data_size = l_data_1._4_4_ - (uint)l_data_1;
                  l_data_1._0_4_ = 0;
                }
                else {
                  memcpy(p_manager_local[1].warning_handler + l_N_ppm,p_buffer,(ulong)l_data_1._4_4_
                        );
                  l_N_ppm = l_data_1._4_4_ + l_N_ppm;
                  l_data_1._0_4_ = (uint)l_data_1 - l_data_1._4_4_;
                  p_buffer = p_buffer + l_data_1._4_4_;
                }
              }
              opj_free(*(void **)((long)p_manager_local[1].m_error_data +
                                 (ulong)l_N_ppm_remaining * 0x10));
              *(undefined8 *)
               ((long)p_manager_local[1].m_error_data + (ulong)l_N_ppm_remaining * 0x10) = 0;
              *(undefined4 *)
               ((long)p_manager_local[1].m_error_data + (ulong)l_N_ppm_remaining * 0x10 + 8) = 0;
            }
          }
          p_manager_local[1].m_warning_data = p_manager_local[1].warning_handler;
          *(undefined4 *)&p_manager_local[2].m_error_data =
               *(undefined4 *)&p_manager_local[1].m_info_data;
          *(undefined4 *)&p_manager_local->info_handler = 0;
          opj_free(p_manager_local[1].m_error_data);
          p_manager_local[1].m_error_data = (void *)0x0;
          p_cp_local._4_4_ = 1;
        }
      }
      else {
        opj_event_msg(_l_ppm_data_size,1,"Corrupted PPM markers\n");
        p_cp_local._4_4_ = 0;
      }
    }
    return p_cp_local._4_4_;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0xf11,"OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *, opj_event_mgr_t *)");
}

Assistant:

static OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *p_cp, opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i, l_ppm_data_size, l_N_ppm_remaining;

    /* preconditions */
    assert(p_cp != 00);
    assert(p_manager != 00);
    assert(p_cp->ppm_buffer == NULL);

    if (p_cp->ppm == 0U) {
        return OPJ_TRUE;
    }

    l_ppm_data_size = 0U;
    l_N_ppm_remaining = 0U;
    for (i = 0U; i < p_cp->ppm_markers_count; ++i) {
        if (p_cp->ppm_markers[i].m_data !=
                NULL) { /* standard doesn't seem to require contiguous Zppm */
            OPJ_UINT32 l_N_ppm;
            OPJ_UINT32 l_data_size = p_cp->ppm_markers[i].m_data_size;
            const OPJ_BYTE* l_data = p_cp->ppm_markers[i].m_data;

            if (l_N_ppm_remaining >= l_data_size) {
                l_N_ppm_remaining -= l_data_size;
                l_data_size = 0U;
            } else {
                l_data += l_N_ppm_remaining;
                l_data_size -= l_N_ppm_remaining;
                l_N_ppm_remaining = 0U;
            }

            if (l_data_size > 0U) {
                do {
                    /* read Nppm */
                    if (l_data_size < 4U) {
                        /* clean up to be done on l_cp destruction */
                        opj_event_msg(p_manager, EVT_ERROR, "Not enough bytes to read Nppm\n");
                        return OPJ_FALSE;
                    }
                    opj_read_bytes(l_data, &l_N_ppm, 4);
                    l_data += 4;
                    l_data_size -= 4;
                    l_ppm_data_size +=
                        l_N_ppm; /* can't overflow, max 256 markers of max 65536 bytes, that is when PPM markers are not corrupted which is checked elsewhere */

                    if (l_data_size >= l_N_ppm) {
                        l_data_size -= l_N_ppm;
                        l_data += l_N_ppm;
                    } else {
                        l_N_ppm_remaining = l_N_ppm - l_data_size;
                        l_data_size = 0U;
                    }
                } while (l_data_size > 0U);
            }
        }
    }

    if (l_N_ppm_remaining != 0U) {
        /* clean up to be done on l_cp destruction */
        opj_event_msg(p_manager, EVT_ERROR, "Corrupted PPM markers\n");
        return OPJ_FALSE;
    }

    p_cp->ppm_buffer = (OPJ_BYTE *) opj_malloc(l_ppm_data_size);
    if (p_cp->ppm_buffer == 00) {
        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPM marker\n");
        return OPJ_FALSE;
    }
    p_cp->ppm_len = l_ppm_data_size;
    l_ppm_data_size = 0U;
    l_N_ppm_remaining = 0U;
    for (i = 0U; i < p_cp->ppm_markers_count; ++i) {
        if (p_cp->ppm_markers[i].m_data !=
                NULL) { /* standard doesn't seem to require contiguous Zppm */
            OPJ_UINT32 l_N_ppm;
            OPJ_UINT32 l_data_size = p_cp->ppm_markers[i].m_data_size;
            const OPJ_BYTE* l_data = p_cp->ppm_markers[i].m_data;

            if (l_N_ppm_remaining >= l_data_size) {
                memcpy(p_cp->ppm_buffer + l_ppm_data_size, l_data, l_data_size);
                l_ppm_data_size += l_data_size;
                l_N_ppm_remaining -= l_data_size;
                l_data_size = 0U;
            } else {
                memcpy(p_cp->ppm_buffer + l_ppm_data_size, l_data, l_N_ppm_remaining);
                l_ppm_data_size += l_N_ppm_remaining;
                l_data += l_N_ppm_remaining;
                l_data_size -= l_N_ppm_remaining;
                l_N_ppm_remaining = 0U;
            }

            if (l_data_size > 0U) {
                do {
                    /* read Nppm */
                    if (l_data_size < 4U) {
                        /* clean up to be done on l_cp destruction */
                        opj_event_msg(p_manager, EVT_ERROR, "Not enough bytes to read Nppm\n");
                        return OPJ_FALSE;
                    }
                    opj_read_bytes(l_data, &l_N_ppm, 4);
                    l_data += 4;
                    l_data_size -= 4;

                    if (l_data_size >= l_N_ppm) {
                        memcpy(p_cp->ppm_buffer + l_ppm_data_size, l_data, l_N_ppm);
                        l_ppm_data_size += l_N_ppm;
                        l_data_size -= l_N_ppm;
                        l_data += l_N_ppm;
                    } else {
                        memcpy(p_cp->ppm_buffer + l_ppm_data_size, l_data, l_data_size);
                        l_ppm_data_size += l_data_size;
                        l_N_ppm_remaining = l_N_ppm - l_data_size;
                        l_data_size = 0U;
                    }
                } while (l_data_size > 0U);
            }
            opj_free(p_cp->ppm_markers[i].m_data);
            p_cp->ppm_markers[i].m_data = NULL;
            p_cp->ppm_markers[i].m_data_size = 0U;
        }
    }

    p_cp->ppm_data = p_cp->ppm_buffer;
    p_cp->ppm_data_size = p_cp->ppm_len;

    p_cp->ppm_markers_count = 0U;
    opj_free(p_cp->ppm_markers);
    p_cp->ppm_markers = NULL;

    return OPJ_TRUE;
}